

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCoordinatesTests.cpp
# Opt level: O0

TestCaseGroup * vkt::tessellation::createCoordinatesTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  TestNode *this;
  TessCoordTest *this_00;
  SpacingMode local_38;
  TessPrimitiveType local_34;
  int spacingModeNdx;
  int primitiveTypeNdx;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar1,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"tesscoord","Tessellation coordinates tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&spacingModeNdx + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar1
            );
  for (local_34 = TESSPRIMITIVETYPE_TRIANGLES; (int)local_34 < 3;
      local_34 = local_34 + TESSPRIMITIVETYPE_QUADS) {
    for (local_38 = SPACINGMODE_EQUAL; (int)local_38 < 3;
        local_38 = local_38 + SPACINGMODE_FRACTIONAL_ODD) {
      this = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_20)->super_TestNode;
      this_00 = (TessCoordTest *)operator_new(0x78);
      anon_unknown_0::TessCoordTest::TessCoordTest
                (this_00,(TestContext *)
                         group.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data._8_8_,local_34,local_38);
      tcu::TestNode::addChild(this,(TestNode *)this_00);
    }
  }
  pTVar1 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createCoordinatesTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "tesscoord", "Tessellation coordinates tests"));

	for (int primitiveTypeNdx = 0; primitiveTypeNdx < TESSPRIMITIVETYPE_LAST; ++primitiveTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
		group->addChild(new TessCoordTest(testCtx, (TessPrimitiveType)primitiveTypeNdx, (SpacingMode)spacingModeNdx));

	return group.release();
}